

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent *indent)

{
  cmTest *pcVar1;
  cmMakefile *this_00;
  cmListFileBacktrace *backtrace;
  ostream *poVar2;
  cmTarget *this_01;
  char *pcVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  pointer pbVar6;
  string *str;
  allocator local_f9;
  ostream *local_f8;
  string emulatorExe;
  cmGeneratorExpression local_d0;
  cmGeneratorExpression ge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  string local_88;
  string exe;
  
  this->TestGenerated = true;
  backtrace = cmTest::GetBacktrace(this->Test);
  cmGeneratorExpression::cmGeneratorExpression(&ge,backtrace);
  cmScriptGeneratorIndent::Write(indent,os);
  poVar2 = std::operator<<(os,"add_test(");
  std::__cxx11::string::string((string *)&exe,(string *)&this->Test->Name);
  poVar2 = std::operator<<(poVar2,(string *)&exe);
  std::operator<<(poVar2," ");
  local_f8 = os;
  std::__cxx11::string::~string((string *)&exe);
  pcVar1 = this->Test;
  std::__cxx11::string::string
            ((string *)&exe,
             (string *)
             (pcVar1->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  this_00 = this->Test->Makefile;
  this_01 = cmMakefile::FindTargetToUse(this_00,&exe,false);
  if ((this_01 == (cmTarget *)0x0) || (this_01->TargetTypeValue != EXECUTABLE)) {
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_88,(char *)&ge);
    emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
    emulatorExe._M_string_length = 0;
    emulatorExe.field_2._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_88._M_dataplus._M_p,this_00,config,false,
               (cmTarget *)0x0,(cmTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&emulatorExe);
    std::__cxx11::string::assign((char *)&exe);
    std::__cxx11::string::~string((string *)&emulatorExe);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_88);
    cmsys::SystemTools::ConvertToUnixSlashes(&exe);
  }
  else {
    cmTarget::GetFullPath(&emulatorExe,this_01,config,false,false);
    std::__cxx11::string::operator=((string *)&exe,(string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&emulatorExe);
    std::__cxx11::string::string
              ((string *)&emulatorExe,"CROSSCOMPILING_EMULATOR",(allocator *)&local_88);
    pcVar3 = cmTarget::GetProperty(this_01,&emulatorExe);
    std::__cxx11::string::~string((string *)&emulatorExe);
    if (pcVar3 != (char *)0x0) {
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&emulatorExe,pcVar3,(allocator *)&local_88);
      cmSystemTools::ExpandListArgument(&emulatorExe,&emulatorWithArgs,false);
      poVar2 = local_f8;
      std::__cxx11::string::~string((string *)&emulatorExe);
      std::__cxx11::string::string
                ((string *)&emulatorExe,
                 (string *)
                 emulatorWithArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      cmsys::SystemTools::ConvertToUnixSlashes(&emulatorExe);
      cmOutputConverter::EscapeForCMake(&local_88,&emulatorExe);
      poVar5 = std::operator<<(poVar2,(string *)&local_88);
      std::operator<<(poVar5," ");
      std::__cxx11::string::~string((string *)&local_88);
      str = emulatorWithArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      while (str = str + 1,
            str != emulatorWithArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        cmOutputConverter::EscapeForCMake(&local_88,str);
        poVar5 = std::operator<<(poVar2,(string *)&local_88);
        std::operator<<(poVar5," ");
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::__cxx11::string::~string((string *)&emulatorExe);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&emulatorWithArgs);
    }
  }
  cmOutputConverter::EscapeForCMake(&emulatorExe,&exe);
  std::operator<<(local_f8,(string *)&emulatorExe);
  std::__cxx11::string::~string((string *)&emulatorExe);
  pbVar6 = (pcVar1->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar6 = pbVar6 + 1,
        pbVar6 != (pcVar1->Command).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    poVar2 = std::operator<<(local_f8," ");
    cmGeneratorExpression::Parse(&local_d0,(string *)&ge);
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&emulatorWithArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)emulatorWithArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    pcVar3 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_d0.Backtrace,this_00,config,false,
                        (cmTarget *)0x0,(cmTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)&emulatorWithArgs);
    std::__cxx11::string::string((string *)&local_88,pcVar3,&local_f9);
    cmOutputConverter::EscapeForCMake(&emulatorExe,&local_88);
    std::operator<<(poVar2,(string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&emulatorWithArgs);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_d0);
  }
  std::operator<<(local_f8,")\n");
  pcVar1 = this->Test;
  if ((pcVar1->Properties).
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    cmScriptGeneratorIndent::Write(indent,local_f8);
    poVar2 = std::operator<<(local_f8,"set_tests_properties(");
    std::__cxx11::string::string((string *)&emulatorExe,(string *)&this->Test->Name);
    poVar2 = std::operator<<(poVar2,(string *)&emulatorExe);
    std::operator<<(poVar2," PROPERTIES ");
    std::__cxx11::string::~string((string *)&emulatorExe);
    for (p_Var4 = (pcVar1->Properties).
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(pcVar1->Properties).
         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         ._M_t._M_impl.super__Rb_tree_header; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      poVar2 = std::operator<<(local_f8," ");
      poVar2 = std::operator<<(poVar2,(string *)(p_Var4 + 1));
      poVar2 = std::operator<<(poVar2," ");
      cmProperty::GetValue((cmProperty *)(p_Var4 + 2));
      cmGeneratorExpression::Parse(&local_d0,(char *)&ge);
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&emulatorWithArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)emulatorWithArgs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      pcVar3 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_d0.Backtrace,this_00,config,false,
                          (cmTarget *)0x0,(cmTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                          (string *)&emulatorWithArgs);
      std::__cxx11::string::string((string *)&local_88,pcVar3,&local_f9);
      cmOutputConverter::EscapeForCMake(&emulatorExe,&local_88);
      std::operator<<(poVar2,(string *)&emulatorExe);
      std::__cxx11::string::~string((string *)&emulatorExe);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&emulatorWithArgs);
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)&local_d0);
    }
    poVar2 = std::operator<<(local_f8,")");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&exe);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent const& indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(&this->Test->GetBacktrace());

  // Start the test command.
  os << indent << "add_test(" << this->Test->GetName() << " ";

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = command[0];
  cmMakefile* mf = this->Test->GetMakefile();
  cmTarget* target = mf->FindTargetToUse(exe);
  if(target && target->GetType() == cmTarget::EXECUTABLE)
    {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    // Prepend with the emulator when cross compiling if required.
    const char * emulator =
      target->GetProperty("CROSSCOMPILING_EMULATOR");
    if (emulator != 0)
      {
      std::vector<std::string> emulatorWithArgs;
      cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
      std::string emulatorExe(emulatorWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(emulatorExe);
      os << cmOutputConverter::EscapeForCMake(emulatorExe) << " ";
      for(std::vector<std::string>::const_iterator ei =
          emulatorWithArgs.begin()+1;
          ei != emulatorWithArgs.end();
          ++ei)
        {
        os << cmOutputConverter::EscapeForCMake(*ei) << " ";
        }
      }
    }
  else
    {
    // Use the command name given.
    exe = ge.Parse(exe.c_str())->Evaluate(mf, config);
    cmSystemTools::ConvertToUnixSlashes(exe);
    }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);
  for(std::vector<std::string>::const_iterator ci = command.begin()+1;
      ci != command.end(); ++ci)
    {
    os << " " << cmOutputConverter::EscapeForCMake(
                                         ge.Parse(*ci)->Evaluate(mf, config));
    }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  if(!pm.empty())
    {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
    for(cmPropertyMap::const_iterator i = pm.begin();
        i != pm.end(); ++i)
      {
      os << " " << i->first
         << " " << cmOutputConverter::EscapeForCMake(
           ge.Parse(i->second.GetValue())->Evaluate(mf, config));
      }
    os << ")" << std::endl;
    }
}